

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O0

optional<unsigned_long_long,_0> __thiscall
cpptrace::detail::libdwarf::die_object::get_unsigned_attribute(die_object *this,Dwarf_Half attr_num)

{
  source_location location;
  int iVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined6 in_register_00000032;
  die_object *this_00;
  byte bVar3;
  optional<unsigned_long_long,_0> oVar4;
  undefined1 in_stack_ffffffffffffff58 [11];
  source_location local_78 [2];
  unsigned_long_long *local_58;
  unsigned_long_long local_50;
  Dwarf_Unsigned val;
  undefined1 local_40 [8];
  raii_wrapper<Dwarf_Attribute_s_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:161:51),_0,_0,_0>
  attwrapper;
  Dwarf_Attribute_s *local_28;
  Dwarf_Attribute attr;
  die_object *pdStack_18;
  Dwarf_Half attr_num_local;
  die_object *this_local;
  
  this_00 = (die_object *)CONCAT62(in_register_00000032,attr_num);
  attwrapper._8_8_ = &local_28;
  pdStack_18 = this_00;
  this_local = this;
  iVar1 = wrap<Dwarf_Die_s_*,_unsigned_short,_Dwarf_Attribute_s_**,_Dwarf_Error_s_**,_Dwarf_Die_s_*const_&,_unsigned_short_&,_Dwarf_Attribute_s_**,_0>
                    (this_00,dwarf_attr,&this_00->die,(unsigned_short *)((long)&attr + 6),
                     (Dwarf_Attribute_s ***)&attwrapper.deleter);
  if (iVar1 == 0) {
    raii_wrap<Dwarf_Attribute_s_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:161:51),_0,_0>
              (local_40,local_28);
    local_58 = &local_50;
    iVar1 = wrap<Dwarf_Attribute_s_*,_unsigned_long_long_*,_Dwarf_Error_s_**,_Dwarf_Attribute_s_*&,_unsigned_long_long_*,_0>
                      (this_00,dwarf_formudata,&local_28,&local_58);
    bVar3 = iVar1 == 0;
    source_location::source_location
              (local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
               ,0xa5);
    location.line._3_1_ = bVar3;
    location._0_11_ = in_stack_ffffffffffffff58;
    location._12_4_ = iVar1;
    assert_impl<bool>((detail *)(ulong)(bVar3 & 1),true,0x24e009,
                      "optional<Dwarf_Unsigned> cpptrace::detail::libdwarf::die_object::get_unsigned_attribute(Dwarf_Half) const"
                      ,local_78[0].file,location);
    optional<unsigned_long_long,_0>::optional<unsigned_long_long,_0>
              ((optional<unsigned_long_long,_0> *)this,&local_50);
    raii_wrapper<Dwarf_Attribute_s_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp:161:51),_0,_0,_0>
    ::~raii_wrapper((raii_wrapper<Dwarf_Attribute_s_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:161:51),_0,_0,_0>
                     *)local_40);
    uVar2 = extraout_RDX;
  }
  else {
    optional<unsigned_long_long,_0>::optional((optional<unsigned_long_long,_0> *)this);
    uVar2 = extraout_RDX_00;
  }
  oVar4._8_8_ = uVar2;
  oVar4.field_0 = (anon_union_8_2_d41c7fdf_for_optional<unsigned_long_long,_0>_2)this;
  return oVar4;
}

Assistant:

optional<Dwarf_Unsigned> get_unsigned_attribute(Dwarf_Half attr_num) const {
            Dwarf_Attribute attr;
            if(wrap(dwarf_attr, die, attr_num, &attr) == DW_DLV_OK) {
                auto attwrapper = raii_wrap(attr, [] (Dwarf_Attribute attr) { dwarf_dealloc_attribute(attr); });
                // Dwarf_Half form = 0;
                // VERIFY(wrap(dwarf_whatform, attr, &form) == DW_DLV_OK);
                Dwarf_Unsigned val;
                VERIFY(wrap(dwarf_formudata, attr, &val) == DW_DLV_OK);
                return val;
            } else {
                return nullopt;
            }
        }